

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void i386_tr_tb_stop(DisasContextBase *dcbase,CPUState *cpu)

{
  DisasContextBase *__mptr;
  DisasContext *dc;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  if (dcbase->is_jmp == DISAS_TOO_MANY) {
    gen_jmp_im((DisasContext *)dcbase,dcbase->pc_next - *(long *)&dcbase[1].max_insns);
    gen_eob((DisasContext *)dcbase);
  }
  return;
}

Assistant:

static void i386_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);

    if (dc->base.is_jmp == DISAS_TOO_MANY) {
        gen_jmp_im(dc, dc->base.pc_next - dc->cs_base);
        gen_eob(dc);
    }
}